

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_fwd_txfm_sse4.c
# Opt level: O0

void av1_fwd_txfm2d_8x8_sse4_1(int16_t *input,int32_t *coeff,int stride,TX_TYPE tx_type,int bd)

{
  int stride_00;
  int flipud;
  __m128i *in_00;
  byte in_CL;
  int32_t *in_RSI;
  int txh_idx;
  int txw_idx;
  int8_t *shift;
  __m128i out [16];
  __m128i in [16];
  undefined4 in_stack_fffffffffffffdb8;
  undefined4 uVar1;
  uint shift_00;
  __m128i *in_01;
  int16_t *in_stack_fffffffffffffdd8;
  __m128i *in_stack_fffffffffffffe30;
  __m128i *in_stack_fffffffffffffe38;
  longlong local_128 [34];
  byte local_15;
  int32_t *local_10;
  uint shift_01;
  uint shift_02;
  
  uVar1 = 1;
  in_01 = (__m128i *)av1_fwd_txfm_shift_ls[1];
  local_15 = in_CL;
  local_10 = in_RSI;
  stride_00 = get_txw_idx('\x01');
  flipud = get_txh_idx((TX_SIZE)uVar1);
  in_00 = (__m128i *)(ulong)local_15;
  if (in_00 < (__m128i *)0x10) {
    shift_00 = (uint)local_15;
    shift_01 = (uint)local_15;
    shift_02 = (uint)local_15;
    switch(in_00) {
    case (__m128i *)0x0:
      load_buffer_8x8(in_stack_fffffffffffffdd8,in_01,stride_00,flipud,0,shift_02);
      fdct8x8_sse4_1(in_00,(__m128i *)CONCAT44(uVar1,in_stack_fffffffffffffdb8),0,0x8f1448);
      col_txfm_8x8_rounding((__m128i *)&stack0xfffffffffffffdd8,-(int)*(char *)((long)*in_01 + 1));
      transpose_8x8(in_stack_fffffffffffffe38,in_stack_fffffffffffffe30);
      fdct8x8_sse4_1(in_00,(__m128i *)CONCAT44(uVar1,in_stack_fffffffffffffdb8),0,0x8f14a4);
      write_buffer_8x8((__m128i *)&stack0xfffffffffffffdd8,local_10);
      break;
    case (__m128i *)0x1:
      load_buffer_8x8(in_stack_fffffffffffffdd8,in_01,stride_00,flipud,0,shift_02);
      fadst8x8_sse4_1((__m128i *)out[0][1],(__m128i *)out[0][0],shift._4_4_,(int)shift);
      col_txfm_8x8_rounding((__m128i *)&stack0xfffffffffffffdd8,-(int)*(char *)((long)*in_01 + 1));
      transpose_8x8(in_stack_fffffffffffffe38,in_stack_fffffffffffffe30);
      fdct8x8_sse4_1(in_00,(__m128i *)CONCAT44(uVar1,in_stack_fffffffffffffdb8),0,0x8f1575);
      write_buffer_8x8((__m128i *)&stack0xfffffffffffffdd8,local_10);
      break;
    case (__m128i *)0x2:
      load_buffer_8x8(in_stack_fffffffffffffdd8,in_01,stride_00,flipud,0,shift_02);
      fdct8x8_sse4_1(in_00,(__m128i *)CONCAT44(uVar1,in_stack_fffffffffffffdb8),0,0x8f15ea);
      col_txfm_8x8_rounding((__m128i *)&stack0xfffffffffffffdd8,-(int)*(char *)((long)*in_01 + 1));
      transpose_8x8(in_stack_fffffffffffffe38,in_stack_fffffffffffffe30);
      fadst8x8_sse4_1((__m128i *)out[0][1],(__m128i *)out[0][0],shift._4_4_,(int)shift);
      write_buffer_8x8((__m128i *)&stack0xfffffffffffffdd8,local_10);
      break;
    case (__m128i *)0x3:
      load_buffer_8x8(in_stack_fffffffffffffdd8,in_01,stride_00,flipud,0,shift_02);
      fadst8x8_sse4_1((__m128i *)out[0][1],(__m128i *)out[0][0],shift._4_4_,(int)shift);
      col_txfm_8x8_rounding((__m128i *)&stack0xfffffffffffffdd8,-(int)*(char *)((long)*in_01 + 1));
      transpose_8x8(in_stack_fffffffffffffe38,in_stack_fffffffffffffe30);
      fadst8x8_sse4_1((__m128i *)out[0][1],(__m128i *)out[0][0],shift._4_4_,(int)shift);
      write_buffer_8x8((__m128i *)&stack0xfffffffffffffdd8,local_10);
      break;
    case (__m128i *)0x4:
      load_buffer_8x8(in_stack_fffffffffffffdd8,in_01,stride_00,flipud,0,shift_01);
      fadst8x8_sse4_1((__m128i *)out[0][1],(__m128i *)out[0][0],shift._4_4_,(int)shift);
      col_txfm_8x8_rounding((__m128i *)&stack0xfffffffffffffdd8,-(int)*(char *)((long)*in_01 + 1));
      transpose_8x8(in_stack_fffffffffffffe38,in_stack_fffffffffffffe30);
      fdct8x8_sse4_1(in_00,(__m128i *)CONCAT44(uVar1,in_stack_fffffffffffffdb8),0,0x8f17ea);
      write_buffer_8x8((__m128i *)&stack0xfffffffffffffdd8,local_10);
      break;
    case (__m128i *)0x5:
      load_buffer_8x8(in_stack_fffffffffffffdd8,in_01,stride_00,flipud,0,shift_01);
      fdct8x8_sse4_1(in_00,(__m128i *)CONCAT44(uVar1,in_stack_fffffffffffffdb8),0,0x8f1861);
      col_txfm_8x8_rounding((__m128i *)&stack0xfffffffffffffdd8,-(int)*(char *)((long)*in_01 + 1));
      transpose_8x8(in_stack_fffffffffffffe38,in_stack_fffffffffffffe30);
      fadst8x8_sse4_1((__m128i *)out[0][1],(__m128i *)out[0][0],shift._4_4_,(int)shift);
      write_buffer_8x8((__m128i *)&stack0xfffffffffffffdd8,local_10);
      break;
    case (__m128i *)0x6:
      load_buffer_8x8(in_stack_fffffffffffffdd8,in_01,stride_00,flipud,0,shift_01);
      fadst8x8_sse4_1((__m128i *)out[0][1],(__m128i *)out[0][0],shift._4_4_,(int)shift);
      col_txfm_8x8_rounding((__m128i *)&stack0xfffffffffffffdd8,-(int)*(char *)((long)*in_01 + 1));
      transpose_8x8(in_stack_fffffffffffffe38,in_stack_fffffffffffffe30);
      fadst8x8_sse4_1((__m128i *)out[0][1],(__m128i *)out[0][0],shift._4_4_,(int)shift);
      write_buffer_8x8((__m128i *)&stack0xfffffffffffffdd8,local_10);
      break;
    case (__m128i *)0x7:
      load_buffer_8x8(in_stack_fffffffffffffdd8,in_01,stride_00,flipud,0,shift_01);
      fadst8x8_sse4_1((__m128i *)out[0][1],(__m128i *)out[0][0],shift._4_4_,(int)shift);
      col_txfm_8x8_rounding((__m128i *)&stack0xfffffffffffffdd8,-(int)*(char *)((long)*in_01 + 1));
      transpose_8x8(in_stack_fffffffffffffe38,in_stack_fffffffffffffe30);
      fadst8x8_sse4_1((__m128i *)out[0][1],(__m128i *)out[0][0],shift._4_4_,(int)shift);
      write_buffer_8x8((__m128i *)&stack0xfffffffffffffdd8,local_10);
      break;
    case (__m128i *)0x8:
      load_buffer_8x8(in_stack_fffffffffffffdd8,in_01,stride_00,flipud,0,shift_01);
      fadst8x8_sse4_1((__m128i *)out[0][1],(__m128i *)out[0][0],shift._4_4_,(int)shift);
      col_txfm_8x8_rounding((__m128i *)&stack0xfffffffffffffdd8,-(int)*(char *)((long)*in_01 + 1));
      transpose_8x8(in_stack_fffffffffffffe38,in_stack_fffffffffffffe30);
      fadst8x8_sse4_1((__m128i *)out[0][1],(__m128i *)out[0][0],shift._4_4_,(int)shift);
      write_buffer_8x8((__m128i *)&stack0xfffffffffffffdd8,local_10);
      break;
    case (__m128i *)0x9:
      load_buffer_8x8(in_stack_fffffffffffffdd8,in_01,stride_00,flipud,0,shift_01);
      idtx8x8_sse4_1((__m128i *)local_128,(__m128i *)&stack0xfffffffffffffdd8,
                     (int)av1_fwd_cos_bit_col[stride_00][flipud],2);
      col_txfm_8x8_rounding((__m128i *)&stack0xfffffffffffffdd8,-(int)*(char *)((long)*in_01 + 1));
      transpose_8x8(in_stack_fffffffffffffe38,in_stack_fffffffffffffe30);
      idtx8x8_sse4_1((__m128i *)local_128,(__m128i *)&stack0xfffffffffffffdd8,
                     (int)av1_fwd_cos_bit_col[stride_00][flipud],2);
      write_buffer_8x8((__m128i *)&stack0xfffffffffffffdd8,local_10);
      break;
    case (__m128i *)0xa:
      load_buffer_8x8(in_stack_fffffffffffffdd8,in_01,stride_00,flipud,0,shift_01);
      fdct8x8_sse4_1(in_00,(__m128i *)CONCAT44(uVar1,in_stack_fffffffffffffdb8),0,0x8f1c7d);
      col_txfm_8x8_rounding((__m128i *)&stack0xfffffffffffffdd8,-(int)*(char *)((long)*in_01 + 1));
      transpose_8x8(in_stack_fffffffffffffe38,in_stack_fffffffffffffe30);
      idtx8x8_sse4_1((__m128i *)local_128,(__m128i *)&stack0xfffffffffffffdd8,
                     (int)av1_fwd_cos_bit_col[stride_00][flipud],2);
      write_buffer_8x8((__m128i *)&stack0xfffffffffffffdd8,local_10);
      break;
    case (__m128i *)0xb:
      load_buffer_8x8(in_stack_fffffffffffffdd8,in_01,stride_00,flipud,0,shift_01);
      idtx8x8_sse4_1((__m128i *)local_128,(__m128i *)&stack0xfffffffffffffdd8,
                     (int)av1_fwd_cos_bit_col[stride_00][flipud],2);
      col_txfm_8x8_rounding((__m128i *)&stack0xfffffffffffffdd8,-(int)*(char *)((long)*in_01 + 1));
      transpose_8x8(in_stack_fffffffffffffe38,in_stack_fffffffffffffe30);
      fdct8x8_sse4_1(in_00,(__m128i *)CONCAT44(uVar1,in_stack_fffffffffffffdb8),0,0x8f1daa);
      write_buffer_8x8((__m128i *)&stack0xfffffffffffffdd8,local_10);
      break;
    case (__m128i *)0xc:
      load_buffer_8x8(in_stack_fffffffffffffdd8,in_01,stride_00,flipud,0,shift_00);
      fadst8x8_sse4_1((__m128i *)out[0][1],(__m128i *)out[0][0],shift._4_4_,(int)shift);
      col_txfm_8x8_rounding((__m128i *)&stack0xfffffffffffffdd8,-(int)*(char *)((long)*in_01 + 1));
      transpose_8x8(in_stack_fffffffffffffe38,in_stack_fffffffffffffe30);
      idtx8x8_sse4_1((__m128i *)local_128,(__m128i *)&stack0xfffffffffffffdd8,
                     (int)av1_fwd_cos_bit_col[stride_00][flipud],2);
      write_buffer_8x8((__m128i *)&stack0xfffffffffffffdd8,local_10);
      break;
    case (__m128i *)0xd:
      load_buffer_8x8(in_stack_fffffffffffffdd8,in_01,stride_00,flipud,0,shift_00);
      idtx8x8_sse4_1((__m128i *)local_128,(__m128i *)&stack0xfffffffffffffdd8,
                     (int)av1_fwd_cos_bit_col[stride_00][flipud],2);
      col_txfm_8x8_rounding((__m128i *)&stack0xfffffffffffffdd8,-(int)*(char *)((long)*in_01 + 1));
      transpose_8x8(in_stack_fffffffffffffe38,in_stack_fffffffffffffe30);
      fadst8x8_sse4_1((__m128i *)out[0][1],(__m128i *)out[0][0],shift._4_4_,(int)shift);
      write_buffer_8x8((__m128i *)&stack0xfffffffffffffdd8,local_10);
      break;
    case (__m128i *)0xe:
      load_buffer_8x8(in_stack_fffffffffffffdd8,in_01,stride_00,flipud,0,shift_00);
      fadst8x8_sse4_1((__m128i *)out[0][1],(__m128i *)out[0][0],shift._4_4_,(int)shift);
      col_txfm_8x8_rounding((__m128i *)&stack0xfffffffffffffdd8,-(int)*(char *)((long)*in_01 + 1));
      transpose_8x8(in_stack_fffffffffffffe38,in_stack_fffffffffffffe30);
      idtx8x8_sse4_1((__m128i *)local_128,(__m128i *)&stack0xfffffffffffffdd8,
                     (int)av1_fwd_cos_bit_col[stride_00][flipud],2);
      write_buffer_8x8((__m128i *)&stack0xfffffffffffffdd8,local_10);
      break;
    case (__m128i *)0xf:
      load_buffer_8x8(in_stack_fffffffffffffdd8,in_01,stride_00,flipud,0,shift_00);
      idtx8x8_sse4_1((__m128i *)local_128,(__m128i *)&stack0xfffffffffffffdd8,
                     (int)av1_fwd_cos_bit_col[stride_00][flipud],2);
      col_txfm_8x8_rounding((__m128i *)&stack0xfffffffffffffdd8,-(int)*(char *)((long)*in_01 + 1));
      transpose_8x8(in_stack_fffffffffffffe38,in_stack_fffffffffffffe30);
      fadst8x8_sse4_1((__m128i *)out[0][1],(__m128i *)out[0][0],shift._4_4_,(int)shift);
      write_buffer_8x8((__m128i *)&stack0xfffffffffffffdd8,local_10);
    }
  }
  return;
}

Assistant:

void av1_fwd_txfm2d_8x8_sse4_1(const int16_t *input, int32_t *coeff, int stride,
                               TX_TYPE tx_type, int bd) {
  __m128i in[16], out[16];
  const int8_t *shift = av1_fwd_txfm_shift_ls[TX_8X8];
  const int txw_idx = get_txw_idx(TX_8X8);
  const int txh_idx = get_txh_idx(TX_8X8);

  switch (tx_type) {
    case DCT_DCT:
      load_buffer_8x8(input, in, stride, 0, 0, shift[0]);
      fdct8x8_sse4_1(in, out, av1_fwd_cos_bit_col[txw_idx][txh_idx], 2);
      col_txfm_8x8_rounding(out, -shift[1]);
      transpose_8x8(out, in);
      fdct8x8_sse4_1(in, out, av1_fwd_cos_bit_row[txw_idx][txh_idx], 2);
      write_buffer_8x8(out, coeff);
      break;
    case ADST_DCT:
      load_buffer_8x8(input, in, stride, 0, 0, shift[0]);
      fadst8x8_sse4_1(in, out, av1_fwd_cos_bit_col[txw_idx][txh_idx], 2);
      col_txfm_8x8_rounding(out, -shift[1]);
      transpose_8x8(out, in);
      fdct8x8_sse4_1(in, out, av1_fwd_cos_bit_row[txw_idx][txh_idx], 2);
      write_buffer_8x8(out, coeff);
      break;
    case DCT_ADST:
      load_buffer_8x8(input, in, stride, 0, 0, shift[0]);
      fdct8x8_sse4_1(in, out, av1_fwd_cos_bit_col[txw_idx][txh_idx], 2);
      col_txfm_8x8_rounding(out, -shift[1]);
      transpose_8x8(out, in);
      fadst8x8_sse4_1(in, out, av1_fwd_cos_bit_row[txw_idx][txh_idx], 2);
      write_buffer_8x8(out, coeff);
      break;
    case ADST_ADST:
      load_buffer_8x8(input, in, stride, 0, 0, shift[0]);
      fadst8x8_sse4_1(in, out, av1_fwd_cos_bit_col[txw_idx][txh_idx], 2);
      col_txfm_8x8_rounding(out, -shift[1]);
      transpose_8x8(out, in);
      fadst8x8_sse4_1(in, out, av1_fwd_cos_bit_row[txw_idx][txh_idx], 2);
      write_buffer_8x8(out, coeff);
      break;
    case FLIPADST_DCT:
      load_buffer_8x8(input, in, stride, 1, 0, shift[0]);
      fadst8x8_sse4_1(in, out, av1_fwd_cos_bit_col[txw_idx][txh_idx], 2);
      col_txfm_8x8_rounding(out, -shift[1]);
      transpose_8x8(out, in);
      fdct8x8_sse4_1(in, out, av1_fwd_cos_bit_row[txw_idx][txh_idx], 2);
      write_buffer_8x8(out, coeff);
      break;
    case DCT_FLIPADST:
      load_buffer_8x8(input, in, stride, 0, 1, shift[0]);
      fdct8x8_sse4_1(in, out, av1_fwd_cos_bit_col[txw_idx][txh_idx], 2);
      col_txfm_8x8_rounding(out, -shift[1]);
      transpose_8x8(out, in);
      fadst8x8_sse4_1(in, out, av1_fwd_cos_bit_row[txw_idx][txh_idx], 2);
      write_buffer_8x8(out, coeff);
      break;
    case FLIPADST_FLIPADST:
      load_buffer_8x8(input, in, stride, 1, 1, shift[0]);
      fadst8x8_sse4_1(in, out, av1_fwd_cos_bit_col[txw_idx][txh_idx], 2);
      col_txfm_8x8_rounding(out, -shift[1]);
      transpose_8x8(out, in);
      fadst8x8_sse4_1(in, out, av1_fwd_cos_bit_row[txw_idx][txh_idx], 2);
      write_buffer_8x8(out, coeff);
      break;
    case ADST_FLIPADST:
      load_buffer_8x8(input, in, stride, 0, 1, shift[0]);
      fadst8x8_sse4_1(in, out, av1_fwd_cos_bit_col[txw_idx][txh_idx], 2);
      col_txfm_8x8_rounding(out, -shift[1]);
      transpose_8x8(out, in);
      fadst8x8_sse4_1(in, out, av1_fwd_cos_bit_row[txw_idx][txh_idx], 2);
      write_buffer_8x8(out, coeff);
      break;
    case FLIPADST_ADST:
      load_buffer_8x8(input, in, stride, 1, 0, shift[0]);
      fadst8x8_sse4_1(in, out, av1_fwd_cos_bit_col[txw_idx][txh_idx], 2);
      col_txfm_8x8_rounding(out, -shift[1]);
      transpose_8x8(out, in);
      fadst8x8_sse4_1(in, out, av1_fwd_cos_bit_row[txw_idx][txh_idx], 2);
      write_buffer_8x8(out, coeff);
      break;
    case IDTX:
      load_buffer_8x8(input, in, stride, 0, 0, shift[0]);
      idtx8x8_sse4_1(in, out, av1_fwd_cos_bit_col[txw_idx][txh_idx], 2);
      col_txfm_8x8_rounding(out, -shift[1]);
      transpose_8x8(out, in);
      idtx8x8_sse4_1(in, out, av1_fwd_cos_bit_col[txw_idx][txh_idx], 2);
      write_buffer_8x8(out, coeff);
      break;
    case V_DCT:
      load_buffer_8x8(input, in, stride, 0, 0, shift[0]);
      fdct8x8_sse4_1(in, out, av1_fwd_cos_bit_col[txw_idx][txh_idx], 2);
      col_txfm_8x8_rounding(out, -shift[1]);
      transpose_8x8(out, in);
      idtx8x8_sse4_1(in, out, av1_fwd_cos_bit_col[txw_idx][txh_idx], 2);
      write_buffer_8x8(out, coeff);
      break;
    case H_DCT:
      load_buffer_8x8(input, in, stride, 0, 0, shift[0]);
      idtx8x8_sse4_1(in, out, av1_fwd_cos_bit_col[txw_idx][txh_idx], 2);
      col_txfm_8x8_rounding(out, -shift[1]);
      transpose_8x8(out, in);
      fdct8x8_sse4_1(in, out, av1_fwd_cos_bit_col[txw_idx][txh_idx], 2);
      write_buffer_8x8(out, coeff);
      break;
    case V_ADST:
      load_buffer_8x8(input, in, stride, 0, 0, shift[0]);
      fadst8x8_sse4_1(in, out, av1_fwd_cos_bit_col[txw_idx][txh_idx], 2);
      col_txfm_8x8_rounding(out, -shift[1]);
      transpose_8x8(out, in);
      idtx8x8_sse4_1(in, out, av1_fwd_cos_bit_col[txw_idx][txh_idx], 2);
      write_buffer_8x8(out, coeff);
      break;
    case H_ADST:
      load_buffer_8x8(input, in, stride, 0, 0, shift[0]);
      idtx8x8_sse4_1(in, out, av1_fwd_cos_bit_col[txw_idx][txh_idx], 2);
      col_txfm_8x8_rounding(out, -shift[1]);
      transpose_8x8(out, in);
      fadst8x8_sse4_1(in, out, av1_fwd_cos_bit_col[txw_idx][txh_idx], 2);
      write_buffer_8x8(out, coeff);
      break;
    case V_FLIPADST:
      load_buffer_8x8(input, in, stride, 1, 0, shift[0]);
      fadst8x8_sse4_1(in, out, av1_fwd_cos_bit_col[txw_idx][txh_idx], 2);
      col_txfm_8x8_rounding(out, -shift[1]);
      transpose_8x8(out, in);
      idtx8x8_sse4_1(in, out, av1_fwd_cos_bit_col[txw_idx][txh_idx], 2);
      write_buffer_8x8(out, coeff);
      break;
    case H_FLIPADST:
      load_buffer_8x8(input, in, stride, 0, 1, shift[0]);
      idtx8x8_sse4_1(in, out, av1_fwd_cos_bit_col[txw_idx][txh_idx], 2);
      col_txfm_8x8_rounding(out, -shift[1]);
      transpose_8x8(out, in);
      fadst8x8_sse4_1(in, out, av1_fwd_cos_bit_col[txw_idx][txh_idx], 2);
      write_buffer_8x8(out, coeff);
      break;
    default: assert(0);
  }
  (void)bd;
}